

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcArbitraryClosedProfileDef::IfcArbitraryClosedProfileDef
          (IfcArbitraryClosedProfileDef *this,void **vtt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  
  pp_Var1 = (_func_int **)vtt[2];
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_IfcProfileDef).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[3];
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_IfcProfileDef).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[4];
  *(undefined1 **)
   &(this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
    field_0x10 = &(this->super_IfcProfileDef).
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x20;
  *(undefined8 *)
   &(this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
    field_0x18 = 0;
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  field_0x20 = 0;
  (this->super_IfcProfileDef).ProfileName.ptr._M_dataplus._M_p =
       (pointer)&(this->super_IfcProfileDef).ProfileName.ptr.field_2;
  (this->super_IfcProfileDef).ProfileName.ptr._M_string_length = 0;
  (this->super_IfcProfileDef).ProfileName.ptr.field_2._M_local_buf[0] = '\0';
  (this->super_IfcProfileDef).ProfileName.have = false;
  pvVar2 = vtt[5];
  *(void **)&(this->super_IfcProfileDef).field_0x58 = pvVar2;
  *(void **)(&(this->super_IfcProfileDef).field_0x58 + *(long *)((long)pvVar2 + -0x18)) = vtt[6];
  *(undefined8 *)&(this->super_IfcProfileDef).field_0x60 = 0;
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_IfcProfileDef).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[7];
  *(void **)&(this->super_IfcProfileDef).field_0x58 = vtt[8];
  *(undefined8 *)&(this->super_IfcProfileDef).field_0x68 = 0;
  return;
}

Assistant:

IfcArbitraryClosedProfileDef() : Object("IfcArbitraryClosedProfileDef") {}